

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::fail
          (HumanResults *this,NameStack *context,string *given,NameStack *whenStack,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  ostream *poVar2;
  
  writeWhenStack(this,context,given,whenStack);
  indent(this,this->whenDepth_ + (ulong)(this->whenDepth_ == 0));
  ::std::operator<<((this->output_).value,"Then : ");
  _Var1._M_head_impl =
       (description->value_)._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    poVar2 = ::std::operator<<((this->output_).value,(string *)_Var1._M_head_impl);
    ::std::operator<<(poVar2,"\n");
    indent(this,this->whenDepth_ + 1 + (ulong)(this->whenDepth_ == 0));
  }
  poVar2 = ::std::operator<<((this->output_).value,"FAILED! ");
  poVar2 = ::std::operator<<(poVar2,(string *)expressionText);
  ::std::operator<<(poVar2,"\n");
  printVariables(this,variableList);
  return;
}

Assistant:

virtual void fail(const NameStack& context,
                          const string& given,
                          const NameStack& whenStack,
                          optional<string> description,
                          const string &expressionText,
                          const vector <Variable> &variableList) override
        {
            writeWhenStack(context, given, whenStack);
            indent(whenDepth());
            (*output_) << "Then : ";

            if (description) {
                *output_ << *description << "\n";
                indent(whenDepth() + 1);
            }

            *output_ << "FAILED! " << expressionText << "\n";
            printVariables(variableList);
        }